

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQInteger __thiscall SQFuncState::PopTarget(SQFuncState *this)

{
  SQUnsignedInteger pos;
  SQUnsignedInteger *pSVar1;
  SQLocalVarInfo *pSVar2;
  long in_RDI;
  SQLocalVarInfo *t;
  SQUnsignedInteger npos;
  
  pSVar1 = (SQUnsignedInteger *)sqvector<long_long>::back((sqvector<long_long> *)(in_RDI + 0x20));
  pos = *pSVar1;
  pSVar2 = sqvector<SQLocalVarInfo>::operator[]((sqvector<SQLocalVarInfo> *)(in_RDI + 8),pos);
  if ((pSVar2->_name).super_SQObject._type == OT_NULL) {
    sqvector<SQLocalVarInfo>::pop_back((sqvector<SQLocalVarInfo> *)0x12fee7);
  }
  sqvector<long_long>::pop_back((sqvector<long_long> *)(in_RDI + 0x20));
  return pos;
}

Assistant:

SQInteger SQFuncState::PopTarget()
{
    SQUnsignedInteger npos=_targetstack.back();
    assert(npos < _vlocals.size());
    SQLocalVarInfo &t = _vlocals[npos];
    if(sq_type(t._name)==OT_NULL){
        _vlocals.pop_back();
    }
    _targetstack.pop_back();
    return npos;
}